

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O2

int parse_args_DSSS(Context_conflict *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  parse_destination_token(ctx);
  require_comma(ctx);
  iVar1 = parse_source_token(ctx);
  require_comma(ctx);
  iVar2 = parse_source_token(ctx);
  require_comma(ctx);
  iVar3 = parse_source_token(ctx);
  return iVar3 + iVar2 + iVar1 + 2;
}

Assistant:

static int parse_args_DSSS(Context *ctx)
{
    int retval = 1;
    retval += parse_destination_token(ctx);
    require_comma(ctx);
    retval += parse_source_token(ctx);
    require_comma(ctx);
    retval += parse_source_token(ctx);
    require_comma(ctx);
    retval += parse_source_token(ctx);
    return retval;
}